

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O0

void __thiscall tracy::Profiler::SendSingleString(Profiler *this,char *ptr,size_t len)

{
  ushort uVar1;
  unsigned_short uVar2;
  ulong uVar3;
  ushort local_b2;
  undefined1 local_b0 [6];
  uint16_t l16;
  QueueItem item;
  size_t len_local;
  char *ptr_local;
  Profiler *this_local;
  bool ret;
  
  local_b0[0] = 0x5b;
  item.field_1._23_8_ = len;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  if (uVar2 < len) {
    __assert_fail("len <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/TracyProfiler.cpp"
                  ,0xb74,"void tracy::Profiler::SendSingleString(const char *, size_t)");
  }
  local_b2 = (ushort)item.field_1._23_8_;
  uVar3 = (item.field_1._23_8_ & 0xffff) + 3;
  if (0x40000 < uVar3) {
    __assert_fail("len <= TargetFrameSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/client/TracyProfiler.hpp"
                  ,0x2db,"bool tracy::Profiler::NeedDataSize(size_t)");
  }
  if (0x40000 < (this->m_bufferOffset - this->m_bufferStart) + (int)uVar3) {
    CommitData(this);
  }
  memcpy(this->m_buffer + this->m_bufferOffset,local_b0,1);
  this->m_bufferOffset = this->m_bufferOffset + 1;
  memcpy(this->m_buffer + this->m_bufferOffset,&local_b2,2);
  uVar1 = local_b2;
  this->m_bufferOffset = this->m_bufferOffset + 2;
  memcpy(this->m_buffer + this->m_bufferOffset,ptr,(ulong)local_b2);
  this->m_bufferOffset = (uint)uVar1 + this->m_bufferOffset;
  return;
}

Assistant:

void Profiler::SendSingleString( const char* ptr, size_t len )
{
    QueueItem item;
    MemWrite( &item.hdr.type, QueueType::SingleStringData );

    assert( len <= std::numeric_limits<uint16_t>::max() );
    auto l16 = uint16_t( len );

    NeedDataSize( QueueDataSize[(int)QueueType::SingleStringData] + sizeof( l16 ) + l16 );

    AppendDataUnsafe( &item, QueueDataSize[(int)QueueType::SingleStringData] );
    AppendDataUnsafe( &l16, sizeof( l16 ) );
    AppendDataUnsafe( ptr, l16 );
}